

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cl_generator.cc
# Opt level: O1

void __thiscall t_cl_generator::init_generator(t_cl_generator *this)

{
  ofstream_with_content_based_conditional_update *poVar1;
  ofstream_with_content_based_conditional_update *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  int *piVar5;
  long *plVar6;
  ostream *poVar7;
  undefined8 *puVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  char *pcVar10;
  size_type *psVar11;
  long *plVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string f_vars_name;
  string f_types_name;
  string program_dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string local_110;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_b0,this);
  iVar4 = mkdir(local_b0._M_dataplus._M_p,0x1ff);
  paVar2 = &local_b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (iVar4 == -1) {
    piVar5 = __errno_location();
    if (*piVar5 != 0x11) {
      pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_f0,this);
      std::__cxx11::string::string((string *)&local_d0,(char *)local_f0,(allocator *)&local_110);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_d0);
      local_b0._M_dataplus._M_p = (pointer)*plVar6;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_b0._M_dataplus._M_p == psVar11) {
        local_b0.field_2._M_allocated_capacity = *psVar11;
        local_b0.field_2._8_8_ = plVar6[3];
        local_b0._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar11;
      }
      local_b0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      pcVar10 = strerror(*piVar5);
      std::operator+(pbVar9,&local_b0,pcVar10);
      __cxa_throw(pbVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_f0,this);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_f0);
  paVar3 = &local_d0.field_2;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_d0.field_2._M_allocated_capacity = *psVar11;
    local_d0.field_2._8_8_ = plVar6[3];
    local_d0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar11;
    local_d0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_d0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_d0,
                              (ulong)(this->super_t_oop_generator).super_t_generator.program_name_.
                                     _M_dataplus._M_p);
  psVar11 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_b0.field_2._M_allocated_capacity = *psVar11;
    local_b0.field_2._8_8_ = plVar6[3];
    local_b0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar11;
    local_b0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_b0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar3) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  iVar4 = mkdir(local_b0._M_dataplus._M_p,0x1ff);
  if (iVar4 == -1) {
    piVar5 = __errno_location();
    if (*piVar5 != 0x11) {
      pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      std::__cxx11::string::string
                ((string *)&local_f0,local_b0._M_dataplus._M_p,(allocator *)&local_110);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_f0);
      local_d0._M_dataplus._M_p = (pointer)*plVar6;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_d0._M_dataplus._M_p == psVar11) {
        local_d0.field_2._M_allocated_capacity = *psVar11;
        local_d0.field_2._8_8_ = plVar6[3];
        local_d0._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar11;
      }
      local_d0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      pcVar10 = strerror(*piVar5);
      std::operator+(pbVar9,&local_d0,pcVar10);
      __cxa_throw(pbVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  this->temporary_var = 0;
  paVar2 = &local_110.field_2;
  local_110._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,local_b0._M_dataplus._M_p,
             local_b0._M_dataplus._M_p + local_b0._M_string_length);
  std::__cxx11::string::append((char *)&local_110);
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_110,
                              (ulong)(this->super_t_oop_generator).super_t_generator.program_name_.
                                     _M_dataplus._M_p);
  plVar12 = plVar6 + 2;
  if ((long *)*plVar6 == plVar12) {
    local_e0 = *plVar12;
    lStack_d8 = plVar6[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar12;
    local_f0 = (long *)*plVar6;
  }
  local_e8 = plVar6[1];
  *plVar6 = (long)plVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_f0);
  psVar11 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_d0.field_2._M_allocated_capacity = *psVar11;
    local_d0.field_2._8_8_ = plVar6[3];
    local_d0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar11;
    local_d0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_d0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  paVar3 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_b0._M_dataplus._M_p,
             local_b0._M_dataplus._M_p + local_b0._M_string_length);
  std::__cxx11::string::append((char *)&local_90);
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,
                              (ulong)(this->super_t_oop_generator).super_t_generator.program_name_.
                                     _M_dataplus._M_p);
  psVar11 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_110.field_2._M_allocated_capacity = *psVar11;
    local_110.field_2._8_8_ = plVar6[3];
    local_110._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar11;
    local_110._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_110._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_110);
  plVar12 = plVar6 + 2;
  if ((long *)*plVar6 == plVar12) {
    local_e0 = *plVar12;
    lStack_d8 = plVar6[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar12;
    local_f0 = (long *)*plVar6;
  }
  local_e8 = plVar6[1];
  *plVar6 = (long)plVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->f_types_).super_ostringstream.
              super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  poVar1 = &this->f_types_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            (poVar1);
  (this->f_types_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x90
       = 0;
  cl_autogen_comment_abi_cxx11_(&local_110,this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_110._M_dataplus._M_p,local_110._M_string_length);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->f_vars_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>
              .field_0x70);
  this_00 = &this->f_vars_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            (this_00);
  (this->f_vars_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x90
       = 0;
  cl_autogen_comment_abi_cxx11_(&local_110,this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this_00,local_110._M_dataplus._M_p,local_110._M_string_length);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  package_def(this,(ostream *)poVar1);
  package_in(this,(ostream *)poVar1);
  package_in(this,(ostream *)this_00);
  if (this->no_asd == false) {
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,local_b0._M_dataplus._M_p,
               local_b0._M_dataplus._M_p + local_b0._M_string_length);
    std::__cxx11::string::append((char *)local_70);
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_70,(ulong)(this->system_prefix)._M_dataplus._M_p);
    plVar12 = plVar6 + 2;
    if ((long *)*plVar6 == plVar12) {
      local_40 = *plVar12;
      lStack_38 = plVar6[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar12;
      local_50 = (long *)*plVar6;
    }
    local_48 = plVar6[1];
    *plVar6 = (long)plVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_50,
                                (ulong)(this->super_t_oop_generator).super_t_generator.program_name_
                                       ._M_dataplus._M_p);
    psVar11 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_90.field_2._M_allocated_capacity = *psVar11;
      local_90.field_2._8_8_ = plVar6[3];
      local_90._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar11;
      local_90._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_90._M_string_length = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
    psVar11 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_110.field_2._M_allocated_capacity = *psVar11;
      local_110.field_2._8_8_ = puVar8[3];
      local_110._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar11;
      local_110._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_110._M_string_length = puVar8[1];
    *puVar8 = psVar11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar3) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    std::__cxx11::string::_M_assign
              ((string *)
               &(this->f_asd_).super_ostringstream.
                super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
    poVar1 = &this->f_asd_;
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
    clear_buf(poVar1);
    (this->f_asd_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x90
         = 0;
    cl_autogen_comment_abi_cxx11_(&local_90,this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar1,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar3) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    asdf_def(this,(ostream *)poVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_cl_generator::init_generator() {
  MKDIR(get_out_dir().c_str());
  string program_dir = get_out_dir() + "/" + program_name_;
  MKDIR(program_dir.c_str());

  temporary_var = 0;

  string f_types_name = program_dir + "/" + program_name_ + "-types.lisp";
  string f_vars_name = program_dir + "/" + program_name_ + "-vars.lisp";

  f_types_.open(f_types_name);
  f_types_ << cl_autogen_comment() << endl;
  f_vars_.open(f_vars_name);
  f_vars_ << cl_autogen_comment() << endl;

  package_def(f_types_);
  package_in(f_types_);
  package_in(f_vars_);

  if (!no_asd) {
    string f_asd_name = program_dir + "/" + system_prefix + program_name_ + ".asd";
    f_asd_.open(f_asd_name);
    f_asd_ << cl_autogen_comment() << endl;
    asdf_def(f_asd_);
  }
}